

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O0

int chacha20_poly1305_seal_scatter
              (uint8_t *key,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,size_t max_out_tag_len
              ,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,uint8_t *extra_in,
              size_t extra_in_len,uint8_t *ad,size_t ad_len,size_t tag_len)

{
  int iVar1;
  undefined1 local_e8 [8];
  chacha20_poly1305_seal_data data;
  size_t i;
  size_t done;
  uint8_t block [64];
  size_t offset;
  uint32_t block_counter;
  uint64_t in_len_64;
  uint8_t *nonce_local;
  size_t max_out_tag_len_local;
  size_t *out_tag_len_local;
  uint8_t *out_tag_local;
  uint8_t *out_local;
  uint8_t *key_local;
  
  if (extra_in_len + tag_len < tag_len) {
    ERR_put_error(0x1e,0,0x75,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                  ,0x73);
    key_local._4_4_ = 0;
  }
  else if (max_out_tag_len < tag_len + extra_in_len) {
    ERR_put_error(0x1e,0,0x67,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                  ,0x77);
    key_local._4_4_ = 0;
  }
  else if (nonce_len == 0xc) {
    if (in_len < 0x3fffffffc0) {
      if (max_out_tag_len < tag_len) {
        ERR_put_error(0x1e,0,0x67,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                      ,0x8c);
        key_local._4_4_ = 0;
      }
      else {
        if (extra_in_len != 0) {
          offset._4_4_ = (uint32_t)(in_len >> 6);
          block._56_8_ = in_len & 0x3f;
          i = 0;
          while (offset._4_4_ = offset._4_4_ + 1, i < extra_in_len) {
            memset(&done,0,0x40);
            CRYPTO_chacha_20((uint8_t *)&done,(uint8_t *)&done,0x40,key,nonce,offset._4_4_);
            data._56_1_ = block[0x38];
            data._57_1_ = block[0x39];
            data._58_1_ = block[0x3a];
            data._59_1_ = block[0x3b];
            data._60_1_ = block[0x3c];
            data._61_1_ = block[0x3d];
            data._62_1_ = block[0x3e];
            data._63_1_ = block[0x3f];
            for (; data.in.extra_ciphertext_len < 0x40 && i < extra_in_len;
                data.in.extra_ciphertext_len = data.in.extra_ciphertext_len + 1) {
              out_tag[i] = extra_in[i] ^ block[data.in.extra_ciphertext_len - 8];
              i = i + 1;
            }
            block[0x38] = '\0';
            block[0x39] = '\0';
            block[0x3a] = '\0';
            block[0x3b] = '\0';
            block[0x3c] = '\0';
            block[0x3d] = '\0';
            block[0x3e] = '\0';
            block[0x3f] = '\0';
          }
        }
        iVar1 = chacha20_poly1305_asm_capable();
        if (iVar1 == 0) {
          CRYPTO_chacha_20(out,in,in_len,key,nonce,1);
          calc_tag(local_e8,key,nonce,ad,ad_len,out,in_len,out_tag,extra_in_len);
        }
        else {
          OPENSSL_memcpy(local_e8,key,0x20);
          data._24_4_ = 0;
          OPENSSL_memcpy(data.in.key + 0x1c,nonce,0xc);
          data.in.extra_ciphertext = (uint8_t *)extra_in_len;
          data._40_8_ = out_tag;
          chacha20_poly1305_seal(out,in,in_len,ad,ad_len,(chacha20_poly1305_seal_data *)local_e8);
        }
        OPENSSL_memcpy(out_tag + extra_in_len,local_e8,tag_len);
        *out_tag_len = extra_in_len + tag_len;
        key_local._4_4_ = 1;
      }
    }
    else {
      ERR_put_error(0x1e,0,0x75,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                    ,0x87);
      key_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(0x1e,0,0x79,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                  ,0x7b);
    key_local._4_4_ = 0;
  }
  return key_local._4_4_;
}

Assistant:

static int chacha20_poly1305_seal_scatter(
    const uint8_t *key, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len, size_t tag_len) {
  if (extra_in_len + tag_len < tag_len) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }
  if (max_out_tag_len < tag_len + extra_in_len) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BUFFER_TOO_SMALL);
    return 0;
  }
  if (nonce_len != 12) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE);
    return 0;
  }

  // |CRYPTO_chacha_20| uses a 32-bit block counter. Therefore we disallow
  // individual operations that work on more than 256GB at a time.
  // |in_len_64| is needed because, on 32-bit platforms, size_t is only
  // 32-bits and this produces a warning because it's always false.
  // Casting to uint64_t inside the conditional is not sufficient to stop
  // the warning.
  const uint64_t in_len_64 = in_len;
  if (in_len_64 >= (UINT64_C(1) << 32) * 64 - 64) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  if (max_out_tag_len < tag_len) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BUFFER_TOO_SMALL);
    return 0;
  }

  // The the extra input is given, it is expected to be very short and so is
  // encrypted byte-by-byte first.
  if (extra_in_len) {
    static const size_t kChaChaBlockSize = 64;
    uint32_t block_counter = (uint32_t)(1 + (in_len / kChaChaBlockSize));
    size_t offset = in_len % kChaChaBlockSize;
    uint8_t block[64 /* kChaChaBlockSize */];

    for (size_t done = 0; done < extra_in_len; block_counter++) {
      memset(block, 0, sizeof(block));
      CRYPTO_chacha_20(block, block, sizeof(block), key, nonce,
                       block_counter);
      for (size_t i = offset; i < sizeof(block) && done < extra_in_len;
           i++, done++) {
        out_tag[done] = extra_in[done] ^ block[i];
      }
      offset = 0;
    }
  }

  union chacha20_poly1305_seal_data data;
  if (chacha20_poly1305_asm_capable()) {
    OPENSSL_memcpy(data.in.key, key, 32);
    data.in.counter = 0;
    OPENSSL_memcpy(data.in.nonce, nonce, 12);
    data.in.extra_ciphertext = out_tag;
    data.in.extra_ciphertext_len = extra_in_len;
    chacha20_poly1305_seal(out, in, in_len, ad, ad_len, &data);
  } else {
    CRYPTO_chacha_20(out, in, in_len, key, nonce, 1);
    calc_tag(data.out.tag, key, nonce, ad, ad_len, out, in_len, out_tag,
             extra_in_len);
  }

  OPENSSL_memcpy(out_tag + extra_in_len, data.out.tag, tag_len);
  *out_tag_len = extra_in_len + tag_len;
  return 1;
}